

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_array_iter_init(BigArrayIter *iter,BigArray *array)

{
  int iVar1;
  long local_30;
  ptrdiff_t stride_contiguous;
  int i;
  size_t elsize;
  BigArray *array_local;
  BigArrayIter *iter_local;
  
  memset(iter,0,0x118);
  iter->array = array;
  memset(iter,0,0x100);
  iter->dataptr = array->data;
  iVar1 = big_file_dtype_itemsize(array->dtype);
  local_30 = (long)iVar1;
  iter->contiguous = 1;
  stride_contiguous._4_4_ = array->ndim;
  while( true ) {
    stride_contiguous._4_4_ = stride_contiguous._4_4_ + -1;
    if (stride_contiguous._4_4_ < 0) {
      return 0;
    }
    if (array->strides[stride_contiguous._4_4_] != local_30) break;
    local_30 = array->dims[stride_contiguous._4_4_] * local_30;
  }
  iter->contiguous = 0;
  return 0;
}

Assistant:

int
big_array_iter_init(BigArrayIter * iter, BigArray * array)
{
    memset(iter, 0, sizeof(iter[0]));

    iter->array = array;

    memset(iter->pos, 0, sizeof(ptrdiff_t) * 32);
    iter->dataptr = array->data;

    /* see if the iter is contiguous */
    size_t elsize = big_file_dtype_itemsize(array->dtype);

    int i = 0; 
    ptrdiff_t stride_contiguous = elsize;
    iter->contiguous = 1;
    for(i = array->ndim - 1; i >= 0; i --) {
        if(array->strides[i] != stride_contiguous) {
            iter->contiguous = 0;
            break;
        }
        stride_contiguous *= array->dims[i];
    }
    return 0;
}